

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TablePrinter.hpp
# Opt level: O0

void __thiscall trl::TablePrinter::PrintHeader(TablePrinter *this)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  ostream *poVar4;
  reference pvVar5;
  string local_38 [32];
  int local_18;
  int local_14;
  TablePrinter *pTStack_10;
  int i;
  TablePrinter *this_local;
  
  pTStack_10 = this;
  PrintHorizontalLine(this,'=');
  std::operator<<(this->m_outStream,"|");
  local_14 = 0;
  while( true ) {
    iVar1 = local_14;
    iVar2 = GetColumnCount(this);
    if (iVar2 <= iVar1) break;
    if ((this->m_flushLeft & 1U) == 0) {
      std::ostream::operator<<(this->m_outStream,std::right);
    }
    else {
      std::ostream::operator<<(this->m_outStream,std::left);
    }
    poVar4 = this->m_outStream;
    pvVar3 = std::vector<int,_std::allocator<int>_>::at(&this->m_columnWidths,(long)local_14);
    local_18 = (int)std::setw(*pvVar3);
    poVar4 = std::operator<<(poVar4,(_Setw)local_18);
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(&this->m_columnTitles,(long)local_14);
    std::vector<int,_std::allocator<int>_>::at(&this->m_columnWidths,(long)local_14);
    std::__cxx11::string::substr((ulong)local_38,(ulong)pvVar5);
    std::operator<<(poVar4,local_38);
    std::__cxx11::string::~string(local_38);
    iVar1 = local_14;
    iVar2 = GetColumnCount(this);
    if (iVar1 != iVar2 + -1) {
      std::operator<<(this->m_outStream,(string *)&this->m_columnSeparator);
    }
    local_14 = local_14 + 1;
  }
  std::operator<<(this->m_outStream,"|\n");
  PrintHorizontalLine(this,'=');
  return;
}

Assistant:

void PrintHeader() {

            PrintHorizontalLine('=');
            m_outStream << "|";

            for (int i = 0; i < GetColumnCount(); ++i) {

                if (m_flushLeft)
                    m_outStream << std::left;
                else
                    m_outStream << std::right;

                m_outStream << std::setw(m_columnWidths.at(i)) << m_columnTitles.at(i).substr(0, m_columnWidths.at(i));
                if (i != GetColumnCount() - 1) {
                    m_outStream << m_columnSeparator;
                }
            }

            m_outStream << "|\n";
            PrintHorizontalLine('=');
        }